

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

void PaUtil_SetOutputChannel(PaUtilBufferProcessor *bp,uint channel,void *data,uint stride)

{
  uint stride_local;
  void *data_local;
  uint channel_local;
  PaUtilBufferProcessor *bp_local;
  
  if (bp->outputChannelCount <= channel) {
    __assert_fail("channel < bp->outputChannelCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                  ,0x243,
                  "void PaUtil_SetOutputChannel(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
                 );
  }
  if (data != (void *)0x0) {
    bp->hostOutputChannels[0][channel].data = data;
    bp->hostOutputChannels[0][channel].stride = stride;
    return;
  }
  __assert_fail("data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                ,0x244,
                "void PaUtil_SetOutputChannel(PaUtilBufferProcessor *, unsigned int, void *, unsigned int)"
               );
}

Assistant:

void PaUtil_SetOutputChannel( PaUtilBufferProcessor* bp,
        unsigned int channel, void *data, unsigned int stride )
{
    assert( channel < bp->outputChannelCount );
    assert( data != NULL );

    bp->hostOutputChannels[0][channel].data = data;
    bp->hostOutputChannels[0][channel].stride = stride;
}